

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<roundTripString>::RegisterTests
          (ParameterizedTestSuiteInfo<roundTripString> *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  reference pIVar5;
  ulong uVar6;
  ostream *poVar7;
  size_type sVar8;
  void *this_01;
  char *pcVar9;
  element_type *peVar10;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  pointer pTVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  undefined1 auVar13 [16];
  CodeLocation local_260;
  string local_238 [32];
  CodeLocation local_218;
  string local_1f0;
  string local_1d0;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  GTestLog local_1a0;
  GTestLog local_19c;
  TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  undefined1 local_170 [8];
  string param_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param;
  iterator __end0_2;
  iterator __begin0_2;
  ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  int local_d4;
  char *pcStack_d0;
  int line;
  char *file;
  undefined1 *name_func;
  undefined1 local_b0 [8];
  ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  generator;
  string *instantiation_name;
  InstantiationInfo *instantiation;
  iterator __end0_1;
  iterator __begin0_1;
  InstantiationContainer *__range4;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo> *test_info;
  iterator __end0;
  iterator __begin0;
  TestInfoContainer *__range3;
  string test_name;
  string test_suite_name;
  bool generated_instantiations;
  ParameterizedTestSuiteInfo<roundTripString> *this_local;
  
  bVar2 = false;
  std::__cxx11::string::string((string *)(test_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range3);
  __end0 = std::
           vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
           ::begin(&this->tests_);
  test_info = (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>
               *)std::
                 vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
                 ::end(&this->tests_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>_>
                                     *)&test_info), bVar1) {
    this_00 = (__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>_>
                 ::operator*(&__end0);
    __end0_1 = std::
               vector<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>
               ::begin(&this->instantiations_);
    instantiation =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>
         ::end(&this->instantiations_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>_>
                               *)&instantiation), bVar1) {
      pIVar5 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>_>
               ::operator*(&__end0_1);
      generator.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar5;
      (*(code *)pIVar5->generator)(local_b0);
      file = pIVar5->name_func;
      pcStack_d0 = pIVar5->file;
      local_d4 = pIVar5->line;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,"/");
        std::__cxx11::string::operator=((string *)(test_name.field_2._M_local_buf + 8),(string *)&i)
        ;
        std::__cxx11::string::~string((string *)&i);
      }
      else {
        std::__cxx11::string::clear();
      }
      std::__cxx11::string::operator+=
                ((string *)(test_name.field_2._M_local_buf + 8),(string *)&this->test_suite_name_);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range5);
      ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::begin((ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&__end0_2);
      ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end((ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&param);
      while (bVar1 = ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator!=(&__end0_2,
                                  (ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&param), bVar1) {
        param_name.field_2._8_8_ =
             ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end0_2);
        bVar2 = true;
        std::__cxx11::string::clear();
        pcVar9 = file;
        TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::TestParamInfo(&local_198,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        param_name.field_2._8_8_,
                        test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*(code *)pcVar9)(local_170,&local_198);
        TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~TestParamInfo(&local_198);
        bVar1 = IsValidParamName((string *)local_170);
        bVar1 = IsTrue(bVar1);
        if (!bVar1) {
          GTestLog::GTestLog(&local_19c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar7 = GTestLog::GetStream(&local_19c);
          poVar7 = std::operator<<(poVar7,"Condition IsValidParamName(param_name) failed. ");
          poVar7 = std::operator<<(poVar7,"Parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_170);
          poVar7 = std::operator<<(poVar7,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar7 = std::operator<<(poVar7,pcStack_d0);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d4);
          poVar7 = std::operator<<(poVar7,"");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_19c);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range5,(key_type *)local_170);
        bVar1 = IsTrue(sVar8 == 0);
        if (!bVar1) {
          GTestLog::GTestLog(&local_1a0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar7 = GTestLog::GetStream(&local_1a0);
          poVar7 = std::operator<<(poVar7,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)local_170);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,pcStack_d0);
          poVar7 = std::operator<<(poVar7," line ");
          this_01 = (void *)std::ostream::operator<<(poVar7,local_d4);
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_1a0);
        }
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(this_00);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::
          __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->(this_00);
          pcVar9 = (char *)std::__cxx11::string::append((string *)&__range3);
          std::__cxx11::string::append(pcVar9);
        }
        std::__cxx11::string::operator+=((string *)&__range3,(string *)local_170);
        pVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range5,(value_type *)local_170);
        local_1b0 = (_Base_ptr)pVar12.first._M_node;
        local_1a8 = pVar12.second;
        std::__cxx11::string::string
                  ((string *)&local_1d0,(string *)(test_name.field_2._M_local_buf + 8));
        auVar13 = std::__cxx11::string::c_str();
        PrintToString<std::__cxx11::string>
                  (&local_1f0,(testing *)param_name.field_2._8_8_,auVar13._8_8_);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        peVar10 = std::
                  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        CodeLocation::CodeLocation(&local_218,&peVar10->code_location);
        iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])();
        set_up_tc = SuiteApiResolver<roundTripString>::GetSetUpCaseOrSuite(pcStack_d0,local_d4);
        tear_down_tc = SuiteApiResolver<roundTripString>::GetTearDownCaseOrSuite
                                 (pcStack_d0,local_d4);
        peVar10 = std::
                  __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        pTVar11 = std::
                  unique_ptr<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator->(&peVar10->test_meta_factory);
        std::__cxx11::string::string(local_238,(string *)param_name.field_2._8_8_);
        iVar3 = (*pTVar11->_vptr_TestMetaFactoryBase[2])(pTVar11,local_238);
        MakeAndRegisterTestInfo
                  (&local_1d0,auVar13._0_8_,(char *)0x0,pcVar9,&local_218,
                   (TypeId)CONCAT44(extraout_var,iVar4),set_up_tc,tear_down_tc,
                   (TestFactoryBase *)CONCAT44(extraout_var_00,iVar3));
        std::__cxx11::string::~string(local_238);
        CodeLocation::~CodeLocation(&local_218);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        std::__cxx11::string::~string((string *)local_170);
        ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end0_2);
      }
      ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~ParamIterator((ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&param);
      ParamIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~ParamIterator(&__end0_2);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range5);
      ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~ParamGenerator((ParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_b0);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::InstantiationInfo>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>_>
    ::operator++(&__end0);
  }
  if (!bVar2) {
    iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      ();
    CodeLocation::CodeLocation(&local_260,&this->code_location_);
    bVar2 = std::
            vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<roundTripString>::TestInfo>_>_>
            ::empty(&this->tests_);
    InsertSyntheticTestCase((string *)CONCAT44(extraout_var_01,iVar4),&local_260,!bVar2);
    CodeLocation::~CodeLocation(&local_260);
  }
  std::__cxx11::string::~string((string *)&__range3);
  std::__cxx11::string::~string((string *)(test_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }